

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O2

cubeb_resampler *
cubeb_resampler_create
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  bool bVar1;
  uint32_t uVar2;
  cubeb_stream_params *pcVar3;
  cubeb_resampler *pcVar4;
  cubeb_resampler_speex_one_way<float> *this;
  cubeb_resampler_speex_one_way<float> *this_00;
  delay_line<float> *pdVar5;
  cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
  *this_01;
  uint source_rate;
  int iVar6;
  _Head_base<0UL,_delay_line<float>_*,_false> _Var7;
  _Head_base<0UL,_delay_line<float>_*,_false> _StackY_48;
  _Head_base<0UL,_delay_line<float>_*,_false> _StackY_40;
  cubeb_stream_params *pcStackY_38;
  
  pcVar3 = input_params;
  if (input_params == (cubeb_stream_params *)0x0) {
    pcVar3 = output_params;
  }
  if (pcVar3->format != CUBEB_SAMPLE_FLOAT32LE) {
    if (pcVar3->format != CUBEB_SAMPLE_S16LE) {
      return (cubeb_resampler *)0x0;
    }
    pcVar4 = cubeb_resampler_create_internal<short>
                       (stream,input_params,output_params,target_rate,callback,user_ptr,quality,
                        reclock);
    return pcVar4;
  }
  _StackY_40._M_head_impl = (delay_line<float> *)0x0;
  _StackY_48._M_head_impl = (delay_line<float> *)0x0;
  if (input_params == (cubeb_stream_params *)0x0) {
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_0010e376;
    this = (cubeb_resampler_speex_one_way<float> *)0x0;
    _Var7._M_head_impl = (delay_line<float> *)0x0;
LAB_0010e5a6:
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Resampling output (%dHz) to target and input rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x244,(ulong)output_params->rate,(ulong)target_rate);
      _Var7._M_head_impl = _StackY_40._M_head_impl;
    }
    this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
               *)operator_new(0x48);
    _StackY_40._M_head_impl = (delay_line<float> *)0x0;
    cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::
    cubeb_resampler_speex
              ((cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                *)this_01,_Var7._M_head_impl,this,stream,callback,user_ptr);
  }
  else {
    source_rate = input_params->rate;
    if (output_params == (cubeb_stream_params *)0x0 || source_rate != target_rate) {
      if (output_params != (cubeb_stream_params *)0x0) goto LAB_0010e3d1;
      if (source_rate == target_rate) goto LAB_0010e37c;
      this = (cubeb_resampler_speex_one_way<float> *)0x0;
      bVar1 = false;
LAB_0010e43e:
      if (source_rate == target_rate) {
LAB_0010e4f7:
        if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
          this = (cubeb_resampler_speex_one_way<float> *)0x0;
        }
        else if (bVar1 && input_params != (cubeb_stream_params *)0x0) {
          pdVar5 = (delay_line<float> *)operator_new(0x48);
          uVar2 = cubeb_resampler_speex_one_way<float>::latency(this);
          delay_line<float>::delay_line(pdVar5,uVar2,input_params->channels,output_params->rate);
          std::__uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_>::reset
                    ((__uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_> *
                     )&_StackY_40,pdVar5);
          _Var7._M_head_impl = _StackY_40._M_head_impl;
          if (_StackY_40._M_head_impl == (delay_line<float> *)0x0) {
            this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
            goto LAB_0010e73c;
          }
          goto LAB_0010e5a6;
        }
        _Var7._M_head_impl = (delay_line<float> *)0x0;
        goto LAB_0010e5a6;
      }
      pcStackY_38 = output_params;
      this_00 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
      iVar6 = -1;
      if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
        iVar6 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
      }
      cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                (this_00,input_params->channels,source_rate,target_rate,iVar6);
      if ((bool)(bVar1 & input_params != (cubeb_stream_params *)0x0 &
                this == (cubeb_resampler_speex_one_way<float> *)0x0)) {
        pdVar5 = (delay_line<float> *)operator_new(0x48);
        uVar2 = cubeb_resampler_speex_one_way<float>::latency(this_00);
        delay_line<float>::delay_line(pdVar5,uVar2,pcStackY_38->channels,pcStackY_38->rate);
        std::__uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_>::reset
                  ((__uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                   &_StackY_48,pdVar5);
        if (_StackY_48._M_head_impl == (delay_line<float> *)0x0) {
          this = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_0010e73c:
          this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                     *)0x0;
          goto LAB_0010e611;
        }
      }
      else if (this != (cubeb_resampler_speex_one_way<float> *)0x0) {
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Resampling input (%d) and output (%d) to target rate of %dHz\n",
                     "cubeb_resampler_internal.h",0x236,(ulong)input_params->rate,
                     (ulong)pcStackY_38->rate,(ulong)target_rate);
        }
        this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                   *)operator_new(0x48);
        cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
        ::cubeb_resampler_speex(this_01,this_00,this,stream,callback,user_ptr);
        goto LAB_0010e60b;
      }
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) to target and output rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x23d,(ulong)input_params->rate,(ulong)target_rate);
      }
      this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                 *)operator_new(0x48);
      _Var7._M_head_impl = _StackY_48._M_head_impl;
      _StackY_48._M_head_impl = (delay_line<float> *)0x0;
      cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>::
      cubeb_resampler_speex
                ((cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                  *)this_01,this_00,_Var7._M_head_impl,stream,callback,user_ptr);
    }
    else {
LAB_0010e376:
      if (output_params->rate != target_rate) {
LAB_0010e3d1:
        uVar2 = output_params->rate;
        if (uVar2 == target_rate) {
          this = (cubeb_resampler_speex_one_way<float> *)0x0;
        }
        else {
          this = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
          iVar6 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
          if (CUBEB_RESAMPLER_QUALITY_DESKTOP < quality) {
            iVar6 = -1;
          }
          cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                    (this,output_params->channels,target_rate,uVar2,iVar6);
        }
        if (input_params != (cubeb_stream_params *)0x0) {
          source_rate = input_params->rate;
          bVar1 = true;
          goto LAB_0010e43e;
        }
        bVar1 = true;
        goto LAB_0010e4f7;
      }
LAB_0010e37c:
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Input and output sample-rate match, target rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x206,target_rate);
      }
      this_01 = (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
                 *)operator_new(0x48);
      if (input_params == (cubeb_stream_params *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = input_params->channels;
      }
      passthrough_resampler<float>::passthrough_resampler
                ((passthrough_resampler<float> *)this_01,stream,callback,user_ptr,uVar2,target_rate)
      ;
    }
  }
LAB_0010e60b:
  this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
  this = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_0010e611:
  std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::~unique_ptr
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)&_StackY_48)
  ;
  std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::~unique_ptr
            ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)&_StackY_40)
  ;
  if (this != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*this->_vptr_cubeb_resampler_speex_one_way[1])(this);
  }
  if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*this_00->_vptr_cubeb_resampler_speex_one_way[1])(this_00);
  }
  return &this_01->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create(cubeb_stream * stream,
                       cubeb_stream_params * input_params,
                       cubeb_stream_params * output_params,
                       unsigned int target_rate, cubeb_data_callback callback,
                       void * user_ptr, cubeb_resampler_quality quality,
                       cubeb_resampler_reclock reclock)
{
  cubeb_sample_format format;

  assert(input_params || output_params);

  if (input_params) {
    format = input_params->format;
  } else {
    format = output_params->format;
  }

  switch (format) {
  case CUBEB_SAMPLE_S16NE:
    return cubeb_resampler_create_internal<short>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  case CUBEB_SAMPLE_FLOAT32NE:
    return cubeb_resampler_create_internal<float>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  default:
    assert(false);
    return nullptr;
  }
}